

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_75d24::CpuAbsoluteIndexedTest_rla_absx_sets_c_with_pagecrossing_Test::TestBody
          (CpuAbsoluteIndexedTest_rla_absx_sets_c_with_pagecrossing_Test *this)

{
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.registers.p = '\x02';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.registers.a = 's';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.expected.a = '\x02';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.expected.p = '\x01';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.field_0x114 = 0x81;
  CpuAbsoluteIndexedTest::run_readwrite_instruction_with_pagecrossing
            (&this->super_CpuAbsoluteIndexedTest,'?',X,'\x02');
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest, rla_absx_sets_c_with_pagecrossing) {
    registers.p = Z_FLAG;
    registers.a = 0b01110011;
    expected.a = 0b00000010;
    expected.p = C_FLAG;
    memory_content = 0b10000001;

    run_readwrite_instruction_with_pagecrossing(
            RLA_ABSX, IndexReg::X, 0b00000010);
}